

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void tree_print_leaf(lyout *out,lys_module *module,int level,uint64_t indent,uint max_name_len,
                    lys_node *node,int spec_config)

{
  char *pcVar1;
  bool bVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char *local_80;
  int local_64;
  int is_key;
  int i;
  lys_module *nodemod;
  lys_node_list *list;
  lys_node *parent;
  lys_node_leaf *leaf;
  uint8_t prefix_len;
  lys_node *node_local;
  uint max_name_len_local;
  uint64_t indent_local;
  int level_local;
  lys_module *module_local;
  lyout *out_local;
  
  bVar2 = false;
  if ((spec_config < 0) || (2 < spec_config)) {
    __assert_fail("spec_config >= 0 && spec_config <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_tree.c"
                  ,0x1bd,
                  "void tree_print_leaf(struct lyout *, const struct lys_module *, int, uint64_t, unsigned int, const struct lys_node *, int)"
                 );
  }
  list = (lys_node_list *)lys_parent(node);
  while( true ) {
    bVar7 = false;
    if (list != (lys_node_list *)0x0) {
      bVar7 = list->nodetype == LYS_USES;
    }
    if (!bVar7) break;
    list = (lys_node_list *)lys_parent((lys_node *)list);
  }
  if ((list != (lys_node_list *)0x0) && (list->nodetype == LYS_LIST)) {
    for (local_64 = 0; local_64 < (int)(uint)list->keys_size; local_64 = local_64 + 1) {
      if (list->keys[local_64] == (lys_node_leaf *)node) {
        bVar2 = true;
        break;
      }
    }
  }
  print_indent(out,indent,level);
  if ((node->flags & 0x10) == 0) {
    local_80 = "+";
    if ((node->flags & 0x20) != 0) {
      local_80 = "o";
    }
  }
  else {
    local_80 = "x";
  }
  ly_print(out,"%s--",local_80);
  tree_print_config(out,node,spec_config);
  leaf._7_1_ = 0;
  plVar3 = lys_node_module(node);
  plVar4 = lys_main_module(module);
  if (plVar4 != plVar3) {
    ly_print(out,"%s:",plVar3->name);
    sVar5 = strlen(plVar3->name);
    leaf._7_1_ = (char)sVar5 + 1;
  }
  pcVar1 = node->name;
  pcVar6 = "?";
  if ((node->flags & 0x40) != 0 || bVar2) {
    pcVar6 = " ";
  }
  sVar5 = strlen(node->name);
  ly_print(out,"%s%s%*s",pcVar1,pcVar6,(ulong)(((max_name_len - (int)sVar5) - (uint)leaf._7_1_) + 3)
           ,"   ");
  tree_print_type(out,(lys_type *)&node[1].ref);
  if (node[1].prev != (lys_node *)0x0) {
    ly_print(out," <%s>",node[1].prev);
  }
  tree_print_features(out,module,node->iffeature,node->iffeature_size);
  ly_print(out,"\n");
  return;
}

Assistant:

static void
tree_print_leaf(struct lyout *out, const struct lys_module *module, int level, uint64_t indent,
                unsigned int max_name_len, const struct lys_node *node, int spec_config)
{
    uint8_t prefix_len;
    struct lys_node_leaf *leaf = (struct lys_node_leaf *)node;
    struct lys_node *parent;
    struct lys_node_list *list;
    struct lys_module *nodemod;
    int i, is_key = 0;

    assert(spec_config >= 0 && spec_config <= 2);

    /* get know if the leaf is a key in a list, in that case it is
     * mandatory by default */
    for (parent = lys_parent(node); parent && parent->nodetype == LYS_USES; parent = lys_parent(parent));
    if (parent && parent->nodetype == LYS_LIST) {
        list = (struct lys_node_list *)parent;
        for (i = 0; i < list->keys_size; i++) {
            if (list->keys[i] == leaf) {
                is_key = 1;
                break;
            }
        }
    }

    print_indent(out, indent, level);
    ly_print(out, "%s--", (leaf->flags & LYS_STATUS_DEPRC ? "x" : (leaf->flags & LYS_STATUS_OBSLT ? "o" : "+")));
    tree_print_config(out, node, spec_config);

    prefix_len = 0;
    nodemod = lys_node_module(node);
    if (lys_main_module(module) != nodemod) {
        ly_print(out, "%s:", nodemod->name);
        prefix_len = strlen(nodemod->name)+1;
    }

    ly_print(out, "%s%s%*s", leaf->name, ((leaf->flags & LYS_MAND_TRUE) || is_key ? " " : "?"),
            3 + (int)((max_name_len - strlen(leaf->name)) - prefix_len), "   ");

    tree_print_type(out, &leaf->type);

    if (leaf->dflt) {
        ly_print(out, " <%s>", leaf->dflt);
    }

    tree_print_features(out, module, leaf->iffeature, leaf->iffeature_size);

    ly_print(out, "\n");
}